

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::visitTry(Vacuum *this,Try *curr)

{
  bool bVar1;
  bool bVar2;
  PassOptions *pPVar3;
  Module *pMVar4;
  byte local_309;
  EffectAnalyzer local_2e0;
  BasicType local_17c;
  EffectAnalyzer local_178;
  Try *local_18;
  Try *curr_local;
  Vacuum *this_local;
  
  local_18 = curr;
  curr_local = (Try *)this;
  pPVar3 = Pass::getPassOptions((Pass *)this);
  pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                     ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                      &(this->
                       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                       ).
                       super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                     );
  EffectAnalyzer::EffectAnalyzer(&local_178,pPVar3,pMVar4,local_18->body);
  bVar1 = EffectAnalyzer::throws(&local_178);
  EffectAnalyzer::~EffectAnalyzer(&local_178);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_17c = none;
    bVar2 = wasm::Type::operator==
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)52>).
                        super_Expression.type,&local_17c);
    bVar1 = false;
    local_309 = 0;
    if (bVar2) {
      bVar2 = Try::hasCatchAll(local_18);
      local_309 = 0;
      if (bVar2) {
        pPVar3 = Pass::getPassOptions((Pass *)this);
        pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                           ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           );
        EffectAnalyzer::EffectAnalyzer(&local_2e0,pPVar3,pMVar4,(Expression *)local_18);
        bVar1 = true;
        bVar2 = EffectAnalyzer::hasUnremovableSideEffects(&local_2e0);
        local_309 = bVar2 ^ 0xff;
      }
    }
    if (bVar1) {
      EffectAnalyzer::~EffectAnalyzer(&local_2e0);
    }
    if ((local_309 & 1) != 0) {
      ExpressionManipulator::nop<wasm::Try>(local_18);
    }
  }
  else {
    ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               local_18->body);
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    // If try's body does not throw, the whole try-catch can be replaced with
    // the try's body.
    if (!EffectAnalyzer(getPassOptions(), *getModule(), curr->body).throws()) {
      replaceCurrent(curr->body);
      return;
    }

    // The try's body does throw. However, throwing may be the only thing it
    // does, and if the try has a catch-all, then the entire try including
    // children may have no effects. Note that this situation can only happen
    // if we do have a catch-all, so avoid wasted work by checking that first.
    // Also, we can't do this if a result is returned, so check the type.
    if (curr->type == Type::none && curr->hasCatchAll() &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr);
    }
  }